

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Sweep.c
# Opt level: O0

Vec_Int_t * Llb_Nonlin4SweepVars2Q(Aig_Man_t *pAig,Vec_Int_t *vOrder,int fAddLis)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  Vec_Int_t *p;
  Aig_Obj_t *pAVar3;
  int local_34;
  int i;
  Aig_Obj_t *pObj;
  Vec_Int_t *vVars2Q;
  int fAddLis_local;
  Vec_Int_t *vOrder_local;
  Aig_Man_t *pAig_local;
  
  p = Vec_IntAlloc(0);
  iVar2 = Aig_ManObjNumMax(pAig);
  Vec_IntFill(p,iVar2,1);
  for (local_34 = 0; iVar2 = Saig_ManRegNum(pAig), local_34 < iVar2; local_34 = local_34 + 1) {
    pVVar1 = pAig->vCis;
    iVar2 = Saig_ManPiNum(pAig);
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,local_34 + iVar2);
    iVar2 = Llb_ObjBddVar(vOrder,pAVar3);
    Vec_IntWriteEntry(p,iVar2,0);
  }
  if (fAddLis != 0) {
    for (local_34 = 0; iVar2 = Saig_ManRegNum(pAig), local_34 < iVar2; local_34 = local_34 + 1) {
      pVVar1 = pAig->vCos;
      iVar2 = Saig_ManPoNum(pAig);
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,local_34 + iVar2);
      iVar2 = Llb_ObjBddVar(vOrder,pAVar3);
      Vec_IntWriteEntry(p,iVar2,0);
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Llb_Nonlin4SweepVars2Q( Aig_Man_t * pAig, Vec_Int_t * vOrder, int fAddLis )
{
    Vec_Int_t * vVars2Q;
    Aig_Obj_t * pObj;
    int i;
    vVars2Q = Vec_IntAlloc( 0 );
    Vec_IntFill( vVars2Q, Aig_ManObjNumMax(pAig), 1 );
    // add flop outputs
    Saig_ManForEachLo( pAig, pObj, i )
        Vec_IntWriteEntry( vVars2Q, Llb_ObjBddVar(vOrder, pObj), 0 );
    // add flop inputs
    if ( fAddLis )
    Saig_ManForEachLi( pAig, pObj, i )
        Vec_IntWriteEntry( vVars2Q, Llb_ObjBddVar(vOrder, pObj), 0 );
    return vVars2Q;
}